

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O1

void __thiscall
slang::syntax::ConditionalPropertyExprSyntax::setChild
          (ConditionalPropertyExprSyntax *this,size_t index,TokenOrSyntax child)

{
  Info *pIVar1;
  undefined1 uVar2;
  NumericTokenFlags NVar3;
  uint32_t uVar4;
  PropertyExprSyntax *pPVar5;
  ExpressionSyntax *pEVar6;
  variant_alternative_t<0UL,_variant<Token,_const_SyntaxNode_*>_> *pvVar7;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar8;
  ElsePropertyClauseSyntax *pEVar9;
  logic_error *this_00;
  long *plVar10;
  char *func;
  size_type *psVar11;
  long *plVar12;
  long *local_f0;
  long local_e8;
  long local_e0;
  long lStack_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  undefined1 *local_90 [2];
  undefined1 local_80 [16];
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (5 < index) {
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    local_90[0] = local_80;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_90,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/build_O1/extern/slang/source/AllSyntax.cpp"
               ,"");
    plVar10 = (long *)std::__cxx11::string::append((char *)local_90);
    local_d0._M_dataplus._M_p = (pointer)*plVar10;
    psVar11 = (size_type *)(plVar10 + 2);
    if ((size_type *)local_d0._M_dataplus._M_p == psVar11) {
      local_d0.field_2._M_allocated_capacity = *psVar11;
      local_d0.field_2._8_8_ = plVar10[3];
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    }
    else {
      local_d0.field_2._M_allocated_capacity = *psVar11;
    }
    local_d0._M_string_length = plVar10[1];
    *plVar10 = (long)psVar11;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    std::__cxx11::to_string(&local_70,0xaca);
    std::operator+(&local_50,&local_d0,&local_70);
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_b0 = (long *)*plVar10;
    plVar12 = plVar10 + 2;
    if (local_b0 == plVar12) {
      local_a0 = *plVar12;
      lStack_98 = plVar10[3];
      local_b0 = &local_a0;
    }
    else {
      local_a0 = *plVar12;
    }
    local_a8 = plVar10[1];
    *plVar10 = (long)plVar12;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_b0);
    local_f0 = (long *)*plVar10;
    plVar12 = plVar10 + 2;
    if (local_f0 == plVar12) {
      local_e0 = *plVar12;
      lStack_d8 = plVar10[3];
      local_f0 = &local_e0;
    }
    else {
      local_e0 = *plVar12;
    }
    local_e8 = plVar10[1];
    *plVar10 = (long)plVar12;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    std::logic_error::logic_error(this_00,(string *)&local_f0);
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  switch(index) {
  case 0:
    pvVar7 = std::get<0ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                       ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)&child)
    ;
    uVar2 = pvVar7->field_0x2;
    NVar3.raw = (pvVar7->numFlags).raw;
    uVar4 = pvVar7->rawLen;
    pIVar1 = pvVar7->info;
    (this->ifKeyword).kind = pvVar7->kind;
    (this->ifKeyword).field_0x2 = uVar2;
    (this->ifKeyword).numFlags = (NumericTokenFlags)NVar3.raw;
    (this->ifKeyword).rawLen = uVar4;
    (this->ifKeyword).info = pIVar1;
    break;
  case 1:
    pvVar7 = std::get<0ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                       ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)&child)
    ;
    uVar2 = pvVar7->field_0x2;
    NVar3.raw = (pvVar7->numFlags).raw;
    uVar4 = pvVar7->rawLen;
    pIVar1 = pvVar7->info;
    (this->openParen).kind = pvVar7->kind;
    (this->openParen).field_0x2 = uVar2;
    (this->openParen).numFlags = (NumericTokenFlags)NVar3.raw;
    (this->openParen).rawLen = uVar4;
    (this->openParen).info = pIVar1;
    break;
  case 2:
    ppSVar8 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                        ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)&child
                        );
    if (*ppSVar8 == (variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_>)0x0) {
      pEVar6 = (ExpressionSyntax *)0x0;
    }
    else {
      ppSVar8 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                          ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                           &child);
      pEVar6 = SyntaxNode::as<slang::syntax::ExpressionSyntax>(*ppSVar8);
    }
    if (pEVar6 == (ExpressionSyntax *)0x0) {
      func = 
      "slang::not_null<slang::syntax::ExpressionSyntax *>::not_null(U &&) [T = slang::syntax::ExpressionSyntax *, U = slang::syntax::ExpressionSyntax *]"
      ;
LAB_0029937a:
      assert::assertFailed
                ("ptr",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
                 ,0x1b,func);
    }
    (this->condition).ptr = pEVar6;
    break;
  case 3:
    pvVar7 = std::get<0ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                       ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)&child)
    ;
    uVar2 = pvVar7->field_0x2;
    NVar3.raw = (pvVar7->numFlags).raw;
    uVar4 = pvVar7->rawLen;
    pIVar1 = pvVar7->info;
    (this->closeParen).kind = pvVar7->kind;
    (this->closeParen).field_0x2 = uVar2;
    (this->closeParen).numFlags = (NumericTokenFlags)NVar3.raw;
    (this->closeParen).rawLen = uVar4;
    (this->closeParen).info = pIVar1;
    break;
  case 4:
    ppSVar8 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                        ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)&child
                        );
    if (*ppSVar8 == (variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_>)0x0) {
      pPVar5 = (PropertyExprSyntax *)0x0;
    }
    else {
      ppSVar8 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                          ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                           &child);
      pPVar5 = SyntaxNode::as<slang::syntax::PropertyExprSyntax>(*ppSVar8);
    }
    if (pPVar5 == (PropertyExprSyntax *)0x0) {
      func = 
      "slang::not_null<slang::syntax::PropertyExprSyntax *>::not_null(U &&) [T = slang::syntax::PropertyExprSyntax *, U = slang::syntax::PropertyExprSyntax *]"
      ;
      goto LAB_0029937a;
    }
    (this->expr).ptr = pPVar5;
    break;
  case 5:
    ppSVar8 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                        ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)&child
                        );
    if (*ppSVar8 == (variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_>)0x0) {
      pEVar9 = (ElsePropertyClauseSyntax *)0x0;
    }
    else {
      ppSVar8 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                          ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                           &child);
      pEVar9 = (ElsePropertyClauseSyntax *)*ppSVar8;
      if ((pEVar9->super_SyntaxNode).kind != ElsePropertyClause) {
        assert::assertFailed
                  ("T::isKind(kind)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/syntax/SyntaxNode.h"
                   ,0x68,
                   "T &slang::syntax::SyntaxNode::as() [T = slang::syntax::ElsePropertyClauseSyntax]"
                  );
      }
    }
    this->elseClause = pEVar9;
  }
  return;
}

Assistant:

void ConditionalPropertyExprSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: ifKeyword = child.token(); return;
        case 1: openParen = child.token(); return;
        case 2: condition = child.node() ? &child.node()->as<ExpressionSyntax>() : nullptr; return;
        case 3: closeParen = child.token(); return;
        case 4: expr = child.node() ? &child.node()->as<PropertyExprSyntax>() : nullptr; return;
        case 5: elseClause = child.node() ? &child.node()->as<ElsePropertyClauseSyntax>() : nullptr; return;
        default: ASSUME_UNREACHABLE;
    }
}